

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Speedup(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  Gia_Man_t *pGVar4;
  char *pcVar5;
  uint fVeryVerbose;
  int iVar6;
  uint fVerbose;
  char *pcVar7;
  bool bVar8;
  uint local_40;
  uint local_3c;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  local_3c = 2;
  local_40 = 5;
  fVerbose = 0;
  fVeryVerbose = 0;
LAB_00256aba:
  do {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"PNlvwh"), iVar6 = globalUtilOptind, iVar2 == 0x77) {
      fVeryVerbose = fVeryVerbose ^ 1;
    }
    if (iVar2 == -1) {
      pGVar4 = pAbc->pGia;
      if (pGVar4 == (Gia_Man_t *)0x0) {
        pcVar5 = "Abc_CommandAbc9Speedup(): There is no AIG to map.\n";
      }
      else {
        if (pGVar4->vMapping != (Vec_Int_t *)0x0) {
          if (bVar1) {
            pvVar3 = pAbc->pLibLut;
          }
          else {
            pvVar3 = (void *)0x0;
          }
          pGVar4->pLutLib = pvVar3;
          pGVar4 = Gia_ManSpeedup(pGVar4,local_40,local_3c,fVerbose,fVeryVerbose);
          Abc_FrameUpdateGia(pAbc,pGVar4);
          return 0;
        }
        pcVar5 = "Abc_CommandAbc9Speedup(): Mapping of the AIG is not defined.\n";
      }
      iVar6 = -1;
      goto LAB_00256cef;
    }
    if (iVar2 == 0x4e) {
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-N\" should be followed by an integer.\n";
LAB_00256c1b:
        Abc_Print(-1,pcVar5);
        goto LAB_00256c25;
      }
      local_3c = atoi(argv[globalUtilOptind]);
      bVar8 = local_3c - 6 < 0xfffffffb;
    }
    else {
      if (iVar2 == 0x76) {
        fVerbose = fVerbose ^ 1;
        goto LAB_00256aba;
      }
      if (iVar2 == 0x6c) {
        bVar1 = (bool)(bVar1 ^ 1);
        goto LAB_00256aba;
      }
      if (iVar2 != 0x50) goto LAB_00256c25;
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-P\" should be followed by an integer.\n";
        goto LAB_00256c1b;
      }
      local_40 = atoi(argv[globalUtilOptind]);
      bVar8 = local_40 - 0x65 < 0xffffff9c;
    }
    globalUtilOptind = iVar6 + 1;
    if (bVar8) {
LAB_00256c25:
      iVar6 = -2;
      Abc_Print(-2,"usage: &speedup [-P num] [-N num] [-lvwh]\n");
      Abc_Print(-2,"\t           transforms LUT-mapped network into an AIG with choices;\n");
      Abc_Print(-2,"\t           the choices are added to speedup the next round of mapping\n");
      Abc_Print(-2,
                "\t-P <num> : delay delta defining critical path for library model [default = %d%%]\n"
                ,(ulong)local_40);
      Abc_Print(-2,
                "\t-N <num> : the max critical path degree for resynthesis (0 < num < 6) [default = %d]\n"
                ,(ulong)local_3c);
      pcVar5 = "lib";
      if (!bVar1) {
        pcVar5 = "unit";
      }
      Abc_Print(-2,"\t-l       : toggle using unit- or LUT-library-delay model [default = %s]\n",
                pcVar5);
      pcVar7 = "yes";
      pcVar5 = "yes";
      if (fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar5);
      if (fVeryVerbose == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-w       : toggle printing detailed stats for each node [default = %s]\n",
                pcVar7);
      pcVar5 = "\t-h       : print the command usage\n";
LAB_00256cef:
      Abc_Print(iVar6,pcVar5);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Speedup( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int fUseLutLib;
    int Percentage;
    int Degree;
    int fVerbose;
    int c, fVeryVerbose;

    // set defaults
    fUseLutLib   = 0;
    Percentage   = 5;
    Degree       = 2;
    fVerbose     = 0;
    fVeryVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "PNlvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            Percentage = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Percentage < 1 || Percentage > 100 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            Degree = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Degree < 1 || Degree > 5 )
                goto usage;
            break;
        case 'l':
            fUseLutLib ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Speedup(): There is no AIG to map.\n" );
        return 1;
    }
    if ( !Gia_ManHasMapping(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Speedup(): Mapping of the AIG is not defined.\n" );
        return 1;
    }
    pAbc->pGia->pLutLib = fUseLutLib ? pAbc->pLibLut : NULL;
    pTemp = Gia_ManSpeedup( pAbc->pGia, Percentage, Degree, fVerbose, fVeryVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &speedup [-P num] [-N num] [-lvwh]\n" );
    Abc_Print( -2, "\t           transforms LUT-mapped network into an AIG with choices;\n" );
    Abc_Print( -2, "\t           the choices are added to speedup the next round of mapping\n" );
    Abc_Print( -2, "\t-P <num> : delay delta defining critical path for library model [default = %d%%]\n", Percentage );
    Abc_Print( -2, "\t-N <num> : the max critical path degree for resynthesis (0 < num < 6) [default = %d]\n", Degree );
    Abc_Print( -2, "\t-l       : toggle using unit- or LUT-library-delay model [default = %s]\n", fUseLutLib? "lib" : "unit" );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle printing detailed stats for each node [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}